

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::reset_all(http *this)

{
  string_pool *this_00;
  long in_RDI;
  char *sport;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  string_map *in_stack_000000c0;
  string *in_stack_ffffffffffffffd8;
  parser *in_stack_ffffffffffffffe0;
  
  *(undefined1 **)(in_RDI + 0x210) = &(anonymous_namespace)::non_const_empty_string;
  *(undefined1 **)(in_RDI + 0x218) = &(anonymous_namespace)::non_const_empty_string;
  *(undefined1 **)(in_RDI + 0x220) = &(anonymous_namespace)::non_const_empty_string;
  *(undefined1 **)(in_RDI + 0x228) = &(anonymous_namespace)::non_const_empty_string;
  *(undefined1 **)(in_RDI + 0x230) = &(anonymous_namespace)::non_const_empty_string;
  *(undefined1 **)(in_RDI + 0x238) = &(anonymous_namespace)::non_const_empty_string;
  *(undefined8 *)(in_RDI + 0x240) = 0;
  *(undefined1 **)(in_RDI + 0x248) = &(anonymous_namespace)::non_const_empty_string;
  *(undefined1 *)(in_RDI + 0x250) = 0;
  *(undefined1 *)(in_RDI + 0x251) = 0;
  *(undefined4 *)(in_RDI + 0x254) = 0;
  *(undefined1 *)(in_RDI + 0x267) = 0;
  *(undefined1 *)(in_RDI + 0x268) = 0;
  *(undefined1 *)(in_RDI + 0x269) = 0;
  *(undefined1 *)(in_RDI + 0x26a) = 0;
  *(undefined8 *)(in_RDI + 0x270) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x278) = 0;
  *(undefined1 *)(in_RDI + 0x266) = 0;
  cppcms::http::impl::parser::reset(in_stack_ffffffffffffffe0);
  string_map::clear((string_map *)in_stack_ffffffffffffffe0);
  string_pool::clear((string_pool *)in_stack_ffffffffffffffe0);
  string_map::add(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  this_00 = (string_pool *)(in_RDI + 0x38);
  string_pool::add(this_00,in_stack_ffffffffffffffd8);
  string_map::add(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  string_pool::alloc(this_00,(size_t)in_stack_ffffffffffffffd8);
  format_number<int>((int)((ulong)this_00 >> 0x20),(char *)in_stack_ffffffffffffffd8,0x4991e2);
  string_map::add(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  string_map::add(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  connection::reset_all((connection *)0x499222);
  return;
}

Assistant:

void reset_all()
		{
			request_method_ = non_const_empty_string;
			env_script_name_ = non_const_empty_string;
			env_path_info_ = non_const_empty_string;
			env_remote_addr_ = non_const_empty_string;
			env_query_string_ = non_const_empty_string;
			env_content_type_ = non_const_empty_string;
			env_content_length_ = 0;
			request_uri_ = non_const_empty_string;
			headers_done_ = false;
			first_header_observerd_ = false;
			total_read_ = 0;
			is_http_11_ = false;
			client_accepts_keep_alive_ = false;
			keep_alive_ = false;
			chunked_te_ = false;
			output_content_length_ = -1;
			output_written_ = 0;
			eof_callback_ = false;
			input_parser_.reset();

			env_.clear();
			pool_.clear();

			env_.add("SERVER_SOFTWARE",CPPCMS_PACKAGE_NAME "/" CPPCMS_PACKAGE_VERSION);
			env_.add("SERVER_NAME",pool_.add(ip_));
			char *sport = pool_.alloc(10);
			format_number(port_,sport,10);
			env_.add("SERVER_PORT",sport);
			env_.add("GATEWAY_INTERFACE","CGI/1.0");
            connection::reset_all();
		}